

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

int32_t __thiscall
fasttext::Dictionary::getLine
          (Dictionary *this,istream *in,vector<int,_std::allocator<int>_> *words,
          vector<int,_std::allocator<int>_> *labels)

{
  string_view str;
  string_view w;
  string_view w_00;
  string_view token_00;
  __type _Var1;
  int32_t iVar2;
  char *in_RCX;
  Dictionary *in_RDX;
  undefined8 extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined1 auVar3 [16];
  entry_type type;
  int32_t wid;
  uint32_t h;
  int32_t ntokens;
  string token;
  vector<int,_std::allocator<int>_> word_hashes;
  undefined4 in_stack_ffffffffffffff08;
  int32_t in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  string *in_stack_ffffffffffffff18;
  Dictionary *in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff28;
  entry_type in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  entry_type in_stack_ffffffffffffff67;
  int local_5c;
  string local_58 [28];
  int32_t in_stack_ffffffffffffffc4;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc8;
  Dictionary *in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x189051);
  std::__cxx11::string::string(local_58);
  local_5c = 0;
  reset(in_stack_ffffffffffffff20,(istream *)in_stack_ffffffffffffff18);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x18908a);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x189097);
  auVar3._8_8_ = in_stack_ffffffffffffff58;
  auVar3._0_8_ = in_stack_ffffffffffffff50;
  do {
    in_stack_ffffffffffffff2f =
         readWord((Dictionary *)
                  CONCAT17(in_stack_ffffffffffffff2f,
                           CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)),
                  (istream *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    iVar2 = (int32_t)((ulong)in_stack_ffffffffffffff48 >> 0x20);
    if (!(bool)in_stack_ffffffffffffff2f) break;
    std::__cxx11::string::operator_cast_to_basic_string_view(local_58);
    str._M_len._6_1_ = in_stack_ffffffffffffff2e;
    str._M_len._0_6_ = in_stack_ffffffffffffff28;
    str._M_len._7_1_ = in_stack_ffffffffffffff2f;
    str._M_str = (char *)in_RDI;
    hash(in_stack_ffffffffffffff20,str);
    std::__cxx11::string::operator_cast_to_basic_string_view(local_58);
    w._M_len._6_1_ = in_stack_ffffffffffffff2e;
    w._M_len._0_6_ = in_stack_ffffffffffffff28;
    w._M_len._7_1_ = in_stack_ffffffffffffff2f;
    w._M_str = (char *)in_RDI;
    iVar2 = getId(in_stack_ffffffffffffff20,w,(uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    if (iVar2 < 0) {
      auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view(local_58);
      w_00._M_len._6_1_ = in_stack_ffffffffffffff2e;
      w_00._M_len._0_6_ = in_stack_ffffffffffffff28;
      w_00._M_len._7_1_ = in_stack_ffffffffffffff2f;
      w_00._M_str = (char *)in_RDI;
      in_stack_ffffffffffffff2e = getType(in_stack_ffffffffffffff20,w_00);
    }
    else {
      in_stack_ffffffffffffff2e =
           getType((Dictionary *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff0c);
    }
    local_5c = local_5c + 1;
    in_stack_ffffffffffffff67 = in_stack_ffffffffffffff2e;
    if (in_stack_ffffffffffffff2e == word) {
      in_stack_ffffffffffffff20 = in_RDX;
      std::__cxx11::string::operator_cast_to_basic_string_view(local_58);
      token_00._M_str = in_RCX;
      token_00._M_len = in_stack_ffffffffffffffd8;
      in_stack_ffffffffffffff48 = extraout_RDX;
      addSubwords(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,token_00,
                  in_stack_ffffffffffffffc4);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    }
    else if ((in_stack_ffffffffffffff2e == label) && (-1 < iVar2)) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    }
    _Var1 = std::operator==(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_ffffffffffffff2f,
                                               CONCAT16(in_stack_ffffffffffffff2e,
                                                        in_stack_ffffffffffffff28)));
    iVar2 = (int32_t)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  } while (!_Var1);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1892a8);
  addWordNgrams((Dictionary *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                auVar3._8_8_,auVar3._0_8_,iVar2);
  std::__cxx11::string::~string(local_58);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20);
  return local_5c;
}

Assistant:

int32_t Dictionary::getLine(
    std::istream& in,
    std::vector<int32_t>& words,
    std::vector<int32_t>& labels) const {
  std::vector<int32_t> word_hashes;
  std::string token;
  int32_t ntokens = 0;

  reset(in);
  words.clear();
  labels.clear();
  while (readWord(in, token)) {
    uint32_t h = hash(token);
    int32_t wid = getId(token, h);
    entry_type type = wid < 0 ? getType(token) : getType(wid);

    ntokens++;
    if (type == entry_type::word) {
      addSubwords(words, token, wid);
      word_hashes.push_back(h);
    } else if (type == entry_type::label && wid >= 0) {
      labels.push_back(wid - nwords_);
    }
    if (token == EOS) {
      break;
    }
  }
  addWordNgrams(words, word_hashes, args_->wordNgrams);
  return ntokens;
}